

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureGatherTests.cpp
# Opt level: O3

TestInstance * __thiscall
vkt::sr::anon_unknown_0::TextureGather2DArrayCase::createInstance
          (TextureGather2DArrayCase *this,Context *context)

{
  GatherType gatherType;
  OffsetSize OVar1;
  Gather2DArrayArgs *__cur;
  VkPhysicalDeviceProperties *pVVar2;
  TextureGatherInstance *this_00;
  Context *pCVar3;
  pointer pGVar4;
  long lVar5;
  TextureFormat *format;
  vector<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs,_std::allocator<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs>_>
  iterations;
  vector<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs,_std::allocator<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs>_>
  local_50;
  TextureFormat local_38;
  
  gatherType = (this->m_baseParams).gatherType;
  OVar1 = (this->m_baseParams).offsetSize;
  pVVar2 = Context::getDeviceProperties(context);
  if (OVar1 == OFFSETSIZE_NONE) {
    local_38.order = R;
    local_38.type = SNORM_INT8;
  }
  else if (OVar1 == OFFSETSIZE_IMPLEMENTATION_MAXIMUM) {
    local_38.order = (pVVar2->limits).minTexelGatherOffset;
    local_38.type = (pVVar2->limits).maxTexelGatherOffset;
  }
  else if (OVar1 == OFFSETSIZE_MINIMUM_REQUIRED) {
    local_38.order = ~RGB;
    local_38.type = UNORM_BYTE_44;
  }
  else {
    local_38.order = ~R;
    local_38.type = ~SNORM_INT8;
  }
  generate2DArrayCaseIterations
            (&local_50,gatherType,&(this->m_baseParams).textureFormat,(IVec2 *)&local_38,
             &this->m_textureSize);
  this_00 = (TextureGatherInstance *)operator_new(0x2e0);
  TextureGatherInstance::TextureGatherInstance(this_00,context,&this->m_baseParams);
  (this_00->super_ShaderRenderCaseInstance).super_TestInstance._vptr_TestInstance =
       (_func_int **)&PTR__TextureGather2DArrayInstance_00d2d9b0;
  *(undefined8 *)&this_00->field_0x264 = *(undefined8 *)(this->m_textureSize).m_data;
  *(int *)((long)&this_00[1].super_ShaderRenderCaseInstance.super_TestInstance._vptr_TestInstance +
          4) = (this->m_textureSize).m_data[2];
  *(undefined1 (*) [16])&this_00[1].super_ShaderRenderCaseInstance.super_TestInstance.m_context =
       (undefined1  [16])0x0;
  this_00[1].super_ShaderRenderCaseInstance.m_sparseContext.
  super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
  .m_data.ptr = (SparseContext *)0x0;
  pCVar3 = (Context *)
           std::
           _Vector_base<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs,_std::allocator<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs>_>
           ::_M_allocate((_Vector_base<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs,_std::allocator<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs>_>
                          *)(((long)local_50.
                                    super__Vector_base<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs,_std::allocator<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_50.
                                    super__Vector_base<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs,_std::allocator<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            -0x3333333333333333),(size_t)context);
  this_00[1].super_ShaderRenderCaseInstance.super_TestInstance.m_context = pCVar3;
  *(Context **)&this_00[1].super_ShaderRenderCaseInstance.m_imageBackingMode = pCVar3;
  this_00[1].super_ShaderRenderCaseInstance.m_sparseContext.
  super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
  .m_data.ptr = (SparseContext *)
                (((long)local_50.
                        super__Vector_base<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs,_std::allocator<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_50.
                       super__Vector_base<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs,_std::allocator<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs>_>
                       ._M_impl.super__Vector_impl_data._M_start) + (long)pCVar3);
  for (pGVar4 = local_50.
                super__Vector_base<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs,_std::allocator<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pGVar4 != local_50.
                super__Vector_base<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs,_std::allocator<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs>_>
                ._M_impl.super__Vector_impl_data._M_finish; pGVar4 = pGVar4 + 1) {
    *(int *)&pCVar3->m_testCtx = (pGVar4->gatherArgs).componentNdx;
    lVar5 = 1;
    do {
      *(int *)((long)pCVar3 + lVar5 * 8 + -4) = (pGVar4->gatherArgs).offsets[lVar5 + -1].m_data[0];
      *(int *)(&pCVar3->m_testCtx + lVar5) = (pGVar4->gatherArgs).offsets[lVar5 + -1].m_data[1];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 5);
    *(int *)&(pCVar3->m_device).
             super_UniqueBase<vkt::DefaultDevice,_de::DefaultDeleter<vkt::DefaultDevice>_>.m_data.
             field_0xc = pGVar4->layerNdx;
    pCVar3 = (Context *)&pCVar3->m_allocator;
  }
  *(Context **)&this_00[1].super_ShaderRenderCaseInstance.m_imageBackingMode = pCVar3;
  format = &local_38;
  local_38.order = CHANNELORDER_LAST;
  local_38.type = CHANNELTYPE_LAST;
  tcu::Texture2DArray::Texture2DArray
            ((Texture2DArray *)
             &this_00[1].super_ShaderRenderCaseInstance.m_sparseContext.
              super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
              .m_data.field_0x8,format,1,1,1);
  TextureGatherInstance::init(this_00,(EVP_PKEY_CTX *)format);
  if (local_50.
      super__Vector_base<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs,_std::allocator<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.
                    super__Vector_base<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs,_std::allocator<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.
                          super__Vector_base<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs,_std::allocator<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.
                          super__Vector_base<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs,_std::allocator<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return (TestInstance *)this_00;
}

Assistant:

TestInstance* TextureGather2DArrayCase::createInstance (Context& context) const
{
	const vector<Gather2DArrayArgs>		iterations	= generate2DArrayCaseIterations(m_baseParams.gatherType,
																					m_baseParams.textureFormat,
																					getOffsetRange(m_baseParams.offsetSize, context.getDeviceProperties().limits),
																					m_textureSize);

	return new TextureGather2DArrayInstance(context, m_baseParams, m_textureSize, iterations);
}